

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscrollbar.cpp
# Opt level: O0

void __thiscall QScrollBar::contextMenuEvent(QScrollBar *this,QContextMenuEvent *event)

{
  int iVar1;
  QStyle *pQVar2;
  QPoint *pQVar3;
  QMenu *pQVar4;
  QContextMenuEvent *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QMenu *menu;
  bool in_stack_00000033;
  WidgetAttribute in_stack_00000034;
  QWidget *in_stack_00000038;
  QScrollBar *in_stack_00000048;
  QPoint in_stack_00000170;
  QWidget *in_stack_ffffffffffffffc8;
  QWidget *atAction;
  QPoint p;
  QMenu *this_00;
  
  this_00 = *(QMenu **)(in_FS_OFFSET + 0x28);
  atAction = in_RDI;
  pQVar2 = QWidget::style(in_stack_ffffffffffffffc8);
  iVar1 = (**(code **)(*(long *)pQVar2 + 0xf0))(pQVar2,0x3e,0,in_RDI);
  if (iVar1 == 0) {
    QWidget::contextMenuEvent(in_RDI,(QContextMenuEvent *)in_stack_ffffffffffffffc8);
  }
  else {
    pQVar3 = QContextMenuEvent::pos(in_RSI);
    p = *pQVar3;
    pQVar4 = createStandardContextMenu(in_stack_00000048,in_stack_00000170);
    if (pQVar4 != (QMenu *)0x0) {
      QWidget::setAttribute(in_stack_00000038,in_stack_00000034,in_stack_00000033);
      QContextMenuEvent::globalPos(in_RSI);
      QMenu::popup(this_00,(QPoint *)p,(QAction *)atAction);
    }
  }
  if (*(QMenu **)(in_FS_OFFSET + 0x28) != this_00) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollBar::contextMenuEvent(QContextMenuEvent *event)
{
    if (!style()->styleHint(QStyle::SH_ScrollBar_ContextMenu, nullptr, this)) {
        QAbstractSlider::contextMenuEvent(event);
        return;
    }

#if QT_CONFIG(menu)
    QMenu *menu = createStandardContextMenu(event->pos());
    if (!menu)
        return;

    menu->setAttribute(Qt::WA_DeleteOnClose);
    menu->popup(event->globalPos());
#else
    Q_UNUSED(pos)
#endif
}